

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

void ** ll_register(lua_State *L,char *path)

{
  int iVar1;
  void **ppvVar2;
  lua_State *in_RSI;
  lua_State *in_RDI;
  void **plib;
  lua_State *in_stack_00000018;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  undefined8 in_stack_ffffffffffffffe8;
  int idx;
  
  idx = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  lua_pushfstring(in_RDI,"LOADLIB: %s",in_RSI);
  lua_gettable(in_RDI,(int)((ulong)in_RSI >> 0x20));
  iVar1 = lua_type(in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (iVar1 == 0) {
    lua_settop(in_RSI,idx);
    ppvVar2 = (void **)lua_newuserdata((lua_State *)path,(size_t)plib);
    *ppvVar2 = (void *)0x0;
    lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
    lua_setmetatable(in_stack_00000018,L._4_4_);
    lua_pushfstring(in_RDI,"LOADLIB: %s",in_RSI);
    lua_pushvalue(in_RDI,(int)((ulong)in_RSI >> 0x20));
    lua_settable((lua_State *)plib,(int)((ulong)in_RDI >> 0x20));
  }
  else {
    ppvVar2 = (void **)lua_touserdata(in_RDI,(int)((ulong)in_RSI >> 0x20));
  }
  return ppvVar2;
}

Assistant:

static void **ll_register(lua_State *L, const char *path)
{
  void **plib;
  lua_pushfstring(L, "LOADLIB: %s", path);
  lua_gettable(L, LUA_REGISTRYINDEX);  /* check library in registry? */
  if (!lua_isnil(L, -1)) {  /* is there an entry? */
    plib = (void **)lua_touserdata(L, -1);
  } else {  /* no entry yet; create one */
    lua_pop(L, 1);
    plib = (void **)lua_newuserdata(L, sizeof(void *));
    *plib = NULL;
    luaL_getmetatable(L, "_LOADLIB");
    lua_setmetatable(L, -2);
    lua_pushfstring(L, "LOADLIB: %s", path);
    lua_pushvalue(L, -2);
    lua_settable(L, LUA_REGISTRYINDEX);
  }
  return plib;
}